

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t zeGetModuleProcAddrTable(ze_api_version_t version,ze_module_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_module_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((tracing_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
      DAT_0017f628 = pDdiTable->pfnCreate;
      pDdiTable->pfnCreate = tracing_layer::zeModuleCreate;
      DAT_0017f630 = pDdiTable->pfnDestroy;
      pDdiTable->pfnDestroy = tracing_layer::zeModuleDestroy;
      DAT_0017f638 = pDdiTable->pfnDynamicLink;
      pDdiTable->pfnDynamicLink = tracing_layer::zeModuleDynamicLink;
      DAT_0017f640 = pDdiTable->pfnGetNativeBinary;
      pDdiTable->pfnGetNativeBinary = tracing_layer::zeModuleGetNativeBinary;
      DAT_0017f648 = pDdiTable->pfnGetGlobalPointer;
      pDdiTable->pfnGetGlobalPointer = tracing_layer::zeModuleGetGlobalPointer;
      _DAT_0017f650 = pDdiTable->pfnGetKernelNames;
      pDdiTable->pfnGetKernelNames = tracing_layer::zeModuleGetKernelNames;
      DAT_0017f658 = pDdiTable->pfnGetProperties;
      pDdiTable->pfnGetProperties = tracing_layer::zeModuleGetProperties;
      DAT_0017f660 = pDdiTable->pfnGetFunctionPointer;
      pDdiTable->pfnGetFunctionPointer = tracing_layer::zeModuleGetFunctionPointer;
      DAT_0017f668 = pDdiTable->pfnInspectLinkageExt;
      pDdiTable->pfnInspectLinkageExt = tracing_layer::zeModuleInspectLinkageExt;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetModuleProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_module_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.Module;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = tracing_layer::zeModuleCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = tracing_layer::zeModuleDestroy;

    dditable.pfnDynamicLink                              = pDdiTable->pfnDynamicLink;
    pDdiTable->pfnDynamicLink                            = tracing_layer::zeModuleDynamicLink;

    dditable.pfnGetNativeBinary                          = pDdiTable->pfnGetNativeBinary;
    pDdiTable->pfnGetNativeBinary                        = tracing_layer::zeModuleGetNativeBinary;

    dditable.pfnGetGlobalPointer                         = pDdiTable->pfnGetGlobalPointer;
    pDdiTable->pfnGetGlobalPointer                       = tracing_layer::zeModuleGetGlobalPointer;

    dditable.pfnGetKernelNames                           = pDdiTable->pfnGetKernelNames;
    pDdiTable->pfnGetKernelNames                         = tracing_layer::zeModuleGetKernelNames;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = tracing_layer::zeModuleGetProperties;

    dditable.pfnGetFunctionPointer                       = pDdiTable->pfnGetFunctionPointer;
    pDdiTable->pfnGetFunctionPointer                     = tracing_layer::zeModuleGetFunctionPointer;

    dditable.pfnInspectLinkageExt                        = pDdiTable->pfnInspectLinkageExt;
    pDdiTable->pfnInspectLinkageExt                      = tracing_layer::zeModuleInspectLinkageExt;

    return result;
}